

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  int iVar1;
  char *pcVar2;
  cmFunctionBlocker *pcVar3;
  cmListFileContext *pcVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference lff_00;
  bool bVar8;
  cmExecutionStatus local_268;
  uint local_264;
  cmExecutionStatus status;
  uint c;
  uint i;
  string err;
  undefined1 local_230 [7];
  bool isTrue;
  undefined1 local_1f0 [8];
  cmConditionEvaluator conditionEvaluator;
  cmListFileContext conditionContext;
  cmCommandContext commandContext;
  cmListFileContext execContext;
  MessageType messageType;
  undefined1 local_88 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  undefined1 local_48 [16];
  auto_ptr<cmFunctionBlocker> local_38;
  auto_ptr<cmFunctionBlocker> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmWhileFunctionBlocker *this_local;
  
  fb.x_ = (cmFunctionBlocker *)inStatus;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"while");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"endwhile");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_48,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        local_48._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_48);
        cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr
                  (&local_38,(auto_ptr_ref<cmFunctionBlocker>)local_48._8_8_);
        cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)local_48);
        pcVar3 = cmsys::auto_ptr<cmFunctionBlocker>::get(&local_38);
        if (pcVar3 == (cmFunctionBlocker *)0x0) {
          this_local._7_1_ = 0;
        }
        else {
          std::__cxx11::string::string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
                    ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_88);
          cmMakefile::ExpandArguments
                    (mf,&this->Args,
                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_88,(char *)0x0);
          pcVar4 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
          cmListFileContext::cmListFileContext((cmListFileContext *)&commandContext.Line,pcVar4);
          cmCommandContext::cmCommandContext((cmCommandContext *)&conditionContext.Line);
          commandContext.Name.field_2._8_8_ = execContext.FilePath.field_2._8_8_;
          std::__cxx11::string::operator=
                    ((string *)&conditionContext.Line,(string *)&commandContext.Line);
          pcVar4 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
          cmConditionEvaluator::GetConditionContext
                    ((cmListFileContext *)&conditionEvaluator.Policy57Status,mf,
                     (cmCommandContext *)&conditionContext.Line,&pcVar4->FilePath);
          cmMakefile::GetBacktrace
                    ((cmListFileBacktrace *)local_230,mf,(cmCommandContext *)&conditionContext.Line)
          ;
          cmConditionEvaluator::cmConditionEvaluator
                    ((cmConditionEvaluator *)local_1f0,mf,
                     (cmListFileContext *)&conditionEvaluator.Policy57Status,
                     (cmListFileBacktrace *)local_230);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_230);
          err.field_2._M_local_buf[0xf] =
               cmConditionEvaluator::IsTrue
                         ((cmConditionEvaluator *)local_1f0,
                          (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           *)local_88,
                          (string *)
                          &expandedArguments.
                           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (MessageType *)&execContext.Line);
          while (err.field_2._M_local_buf[0xf] != '\0') {
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&i,"had incorrect arguments: ",(allocator *)((long)&c + 3));
              std::allocator<char>::~allocator((allocator<char> *)((long)&c + 3));
              status.ReturnInvoked = false;
              status.BreakInvoked = false;
              status.ContinueInvoked = false;
              status.NestedError = false;
              for (; uVar5 = (ulong)(uint)status,
                  sVar6 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size
                                    (&this->Args), uVar5 < sVar6;
                  status = (cmExecutionStatus)((int)status + 1)) {
                pvVar7 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                pcVar2 = "";
                if (pvVar7->Delim != Unquoted) {
                  pcVar2 = "\"";
                }
                std::__cxx11::string::operator+=((string *)&i,pcVar2);
                pvVar7 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                std::__cxx11::string::operator+=((string *)&i,(string *)pvVar7);
                pvVar7 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
                         operator[](&this->Args,(ulong)(uint)status);
                pcVar2 = "";
                if (pvVar7->Delim != Unquoted) {
                  pcVar2 = "\"";
                }
                std::__cxx11::string::operator+=((string *)&i,pcVar2);
                std::__cxx11::string::operator+=((string *)&i," ");
              }
              std::__cxx11::string::operator+=((string *)&i,"(");
              std::__cxx11::string::operator+=
                        ((string *)&i,
                         (string *)
                         &expandedArguments.
                          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator+=((string *)&i,").");
              cmMakefile::IssueMessage(mf,(MessageType)execContext.Line,(string *)&i,false);
              bVar8 = (MessageType)execContext.Line == FATAL_ERROR;
              if (bVar8) {
                cmSystemTools::SetFatalErrorOccured();
                this_local._7_1_ = 1;
              }
              std::__cxx11::string::~string((string *)&i);
              if (bVar8) goto LAB_004fcc71;
            }
            for (local_264 = 0; uVar5 = (ulong)local_264,
                sVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                                  (&this->Functions), uVar5 < sVar6; local_264 = local_264 + 1) {
              cmExecutionStatus::cmExecutionStatus(&local_268);
              lff_00 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                       operator[](&this->Functions,(ulong)local_264);
              cmMakefile::ExecuteCommand(mf,lff_00,&local_268);
              bVar8 = cmExecutionStatus::GetReturnInvoked(&local_268);
              if (bVar8) {
                cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)fb.x_,true);
                this_local._7_1_ = 1;
                goto LAB_004fcc71;
              }
              bVar8 = cmExecutionStatus::GetBreakInvoked(&local_268);
              if (bVar8) {
                this_local._7_1_ = 1;
                goto LAB_004fcc71;
              }
              bVar8 = cmExecutionStatus::GetContinueInvoked(&local_268);
              if (bVar8) break;
              bVar8 = cmSystemTools::GetFatalErrorOccured();
              if (bVar8) {
                this_local._7_1_ = 1;
                goto LAB_004fcc71;
              }
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            clear((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_88);
            cmMakefile::ExpandArguments
                      (mf,&this->Args,
                       (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_88,(char *)0x0);
            err.field_2._M_local_buf[0xf] =
                 cmConditionEvaluator::IsTrue
                           ((cmConditionEvaluator *)local_1f0,
                            (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             *)local_88,
                            (string *)
                            &expandedArguments.
                             super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (MessageType *)&execContext.Line);
          }
          this_local._7_1_ = 1;
LAB_004fcc71:
          cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_1f0);
          cmListFileContext::~cmListFileContext
                    ((cmListFileContext *)&conditionEvaluator.Policy57Status);
          cmCommandContext::~cmCommandContext((cmCommandContext *)&conditionContext.Line);
          cmListFileContext::~cmListFileContext((cmListFileContext *)&commandContext.Line);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_88);
          std::__cxx11::string::~string
                    ((string *)
                     &expandedArguments.
                      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_38);
        goto LAB_004fcd3f;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  this_local._7_1_ = 1;
LAB_004fcd3f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmWhileFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"while"))
    {
    // record the number of while commands past this one
    this->Depth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endwhile"))
    {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmListFileContext conditionContext =
          cmConditionEvaluator::GetConditionContext(
            &mf, commandContext,
            this->GetStartingContext().FilePath);

      cmConditionEvaluator conditionEvaluator(
            mf, conditionContext,
            mf.GetBacktrace(commandContext));

      bool isTrue = conditionEvaluator.IsTrue(
        expandedArguments, errorString, messageType);

      while (isTrue)
        {
        if (!errorString.empty())
          {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for(i =0; i < this->Args.size(); ++i)
            {
            err += (this->Args[i].Delim?"\"":"");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim?"\"":"");
            err += " ";
            }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR)
            {
            cmSystemTools::SetFatalErrorOccured();
            return true;
            }
          }

        // Invoke all the functions that were collected in the block.
        for(unsigned int c = 0; c < this->Functions.size(); ++c)
          {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            return true;
            }
          if (status.GetContinueInvoked())
            {
            break;
            }
          if(cmSystemTools::GetFatalErrorOccured() )
            {
            return true;
            }
          }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(
          expandedArguments, errorString, messageType);
        }
      return true;
      }
    else
      {
      // decrement for each nested while that ends
      this->Depth--;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}